

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::detail::SocketStream::SocketStream
          (SocketStream *this,socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
          time_t write_timeout_sec,time_t write_timeout_usec)

{
  allocator_type local_a;
  value_type_conflict local_9;
  
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__SocketStream_0016c0d0;
  this->sock_ = sock;
  this->read_timeout_sec_ = read_timeout_sec;
  this->read_timeout_usec_ = read_timeout_usec;
  this->write_timeout_sec_ = write_timeout_sec;
  this->write_timeout_usec_ = write_timeout_usec;
  local_9 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->read_buff_,0x1000,&local_9,&local_a);
  this->read_buff_off_ = 0;
  this->read_buff_content_size_ = 0;
  return;
}

Assistant:

inline SocketStream::SocketStream(socket_t sock, time_t read_timeout_sec,
                                  time_t read_timeout_usec,
                                  time_t write_timeout_sec,
                                  time_t write_timeout_usec)
    : sock_(sock), read_timeout_sec_(read_timeout_sec),
      read_timeout_usec_(read_timeout_usec),
      write_timeout_sec_(write_timeout_sec),
      write_timeout_usec_(write_timeout_usec), read_buff_(read_buff_size_, 0) {}